

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<IntView<2>_>::push(vec<IntView<2>_> *this,IntView<2> *elem)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  IntView<2> *pIVar4;
  ulong uVar5;
  
  uVar1 = this->cap;
  if (this->sz == uVar1) {
    uVar5 = 2;
    if (1 < uVar1) {
      uVar5 = (ulong)(uVar1 * 3 + 1 >> 1);
    }
    this->cap = (uint)uVar5;
    pIVar4 = (IntView<2> *)realloc(this->data,uVar5 << 4);
    this->data = pIVar4;
  }
  uVar1 = this->sz;
  this->sz = uVar1 + 1;
  iVar2 = elem->a;
  iVar3 = elem->b;
  pIVar4 = this->data + uVar1;
  pIVar4->var = elem->var;
  pIVar4->a = iVar2;
  pIVar4->b = iVar3;
  return;
}

Assistant:

void push(const T& elem) {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T(elem);
	}